

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O1

void __thiscall xray_re::xr_sector_object::load(xr_sector_object *this,xr_reader *r)

{
  size_t sVar1;
  uint16_t version;
  xr_reader *s;
  short local_1a;
  xr_reader *local_18;
  
  sVar1 = xr_reader::r_raw_chunk(r,0xf010,&local_1a,2);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x1e,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  if (local_1a != 0x11) {
    __assert_fail("version == SECTOR_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x1f,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar1 = xr_reader::r_raw_chunk(r,0xf020,&(this->super_xr_custom_object).field_0x6c,0x10);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x22,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  sVar1 = xr_reader::r_raw_chunk(r,0xf025,&this->m_private,1);
  if (sVar1 != 0) {
    local_18 = xr_reader::open_chunk(r,0xf030);
    if (local_18 != (xr_reader *)0x0) {
      xr_reader::
      r_chunks<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,read_item>
                (local_18,&this->m_items);
      xr_reader::close_chunk(r,&local_18);
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                ,0x24,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
}

Assistant:

void xr_sector_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SECTOR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SECTOR_VERSION);
	xr_custom_object::load(r);
	if (!r.r_chunk<fcolor>(SECTOR_CHUNK_COLOR, m_color))
		xr_not_expected();
	if (!r.r_chunk<uint8_t>(SECTOR_CHUNK_PRIVATE, m_private))
		xr_not_expected();
	xr_reader* s = r.open_chunk(SECTOR_CHUNK_ITEMS);
	if (s) {
		s->r_chunks(m_items, read_item());
		r.close_chunk(s);
	}
}